

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::IsGroupOf_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IsGroupOf_PDU *this)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference this_00;
  GED *pGVar4;
  KINT32 Value;
  string local_238 [39];
  byte local_211;
  undefined1 local_210 [7];
  KUINT8 i;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IsGroupOf_PDU *local_18;
  IsGroupOf_PDU *this_local;
  
  local_18 = this;
  this_local = (IsGroupOf_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Is Group Of PDU-\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_GroupedEntityID);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Grouped Entity Category:         ");
  DATA_TYPE::ENUMS::GetEnumAsStringGroupedEntityCategory_abi_cxx11_
            ((KString *)local_210,(ENUMS *)(ulong)this->m_ui8GrpdEntCat,Value);
  poVar1 = std::operator<<(poVar1,(string *)local_210);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Number Of Grouped Entity:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8NumOfGroupedEnts);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Group Reference Point(Lat,Lon) : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this->m_f64GrpLat);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this->m_f64GrpLon);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  local_211 = 0;
  while( true ) {
    uVar2 = (ulong)local_211;
    sVar3 = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
            ::size(&this->m_vpGED);
    if (sVar3 <= uVar2) break;
    this_00 = std::
              vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
              ::operator[](&this->m_vpGED,(ulong)local_211);
    pGVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::operator->(this_00);
    (*(pGVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(local_238);
    std::operator<<(local_190,local_238);
    std::__cxx11::string::~string(local_238);
    local_211 = local_211 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IsGroupOf_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Is Group Of PDU-\n"
       << m_GroupedEntityID.GetAsString()
       << "Grouped Entity Category:         " << GetEnumAsStringGroupedEntityCategory( m_ui8GrpdEntCat ) << "\n"
       << "Number Of Grouped Entity:        " << ( KUINT16 )m_ui8NumOfGroupedEnts                        << "\n"
       << "Group Reference Point(Lat,Lon) : " << m_f64GrpLat << " , " << m_f64GrpLon                     << "\n";

    KUINT8 i = 0;

    while( i < m_vpGED.size() )
    {
        ss << m_vpGED[i]->GetAsString();
        ++i;
    }

    return ss.str();
}